

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

void __thiscall
lzham::raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model
          (raw_quasi_adaptive_huffman_data_model *this)

{
  decoder_tables *p;
  uint32 *puVar1;
  uint16 *puVar2;
  uchar *p_00;
  unsigned_short *puVar3;
  
  p = this->m_pDecode_tables;
  if (p != (decoder_tables *)0x0) {
    puVar1 = p->m_lookup;
    if ((puVar1 != (uint32 *)0x0) && ((puVar1[-2] ^ puVar1[-1]) == 0xffffffff)) {
      lzham_free(puVar1 + -4);
    }
    puVar2 = p->m_sorted_symbol_order;
    if ((puVar2 != (uint16 *)0x0) &&
       ((*(uint *)(puVar2 + -4) ^ *(uint *)(puVar2 + -2)) == 0xffffffff)) {
      lzham_free(puVar2 + -8);
    }
    lzham_free(p);
  }
  p_00 = (this->m_code_sizes).m_p;
  if (p_00 != (uchar *)0x0) {
    lzham_free(p_00);
  }
  puVar3 = (this->m_codes).m_p;
  if (puVar3 != (unsigned_short *)0x0) {
    lzham_free(puVar3);
  }
  puVar3 = (this->m_sym_freq).m_p;
  if (puVar3 != (unsigned_short *)0x0) {
    lzham_free(puVar3);
  }
  return;
}

Assistant:

raw_quasi_adaptive_huffman_data_model::~raw_quasi_adaptive_huffman_data_model()
   {
      if (m_pDecode_tables)
         lzham_delete(m_pDecode_tables);
   }